

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

SIMDExtractOp __thiscall
wasm::Random::pick<wasm::SIMDExtractOp>(Random *this,FeatureOptions<wasm::SIMDExtractOp> *picker)

{
  SIMDExtractOp SVar1;
  value_type *pvVar2;
  _Vector_base<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_> local_30;
  
  items<wasm::SIMDExtractOp>
            ((vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_> *)&local_30,this,
             picker);
  pvVar2 = pick<std::vector<wasm::SIMDExtractOp,std::allocator<wasm::SIMDExtractOp>>>
                     (this,(vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_> *)
                           &local_30);
  SVar1 = *pvVar2;
  std::_Vector_base<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>::~_Vector_base
            (&local_30);
  return SVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }